

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O1

void valid_option(int argc,char **argv,char *in_path,char *out_path,int *n1,int *n2,int *level,
                 int *h_type,int *histo,int *sm,int *sp,int *sf,int *pyr,int *ssd,int *f_type,
                 float *trsh,char *i_fname,char *v_fname,char *c_fname,char *h_fname,int *nbin,
                 float *incr,int *iter,int *binary,int *row,int *col)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  disp_field512_t *padVar4;
  disp_field512_t *padVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  qnode_ptr_t p;
  qnode_ptr_t p_00;
  long lVar12;
  int extraout_EDX;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  char **ppcVar19;
  char **__s2;
  char *__src;
  long lVar20;
  undefined4 in_register_0000003c;
  char *__dest;
  int iVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  string t0;
  int iStack_1f0;
  int iStack_1ec;
  char local_128 [80];
  int local_d8 [20];
  char local_88 [88];
  
  __dest = (char *)CONCAT44(in_register_0000003c,argc);
  if (argc == 1) {
LAB_00104b0b:
    usage();
  }
  if (argc - 4U < 0x15) {
    *binary = 0;
    *sm = 1;
    *sp = 1;
    *sf = 0;
    *pyr = 2;
    *level = 1;
    *histo = 0;
    *ssd = 3;
    *trsh = 0.0;
    *nbin = 0;
    *iter = 10;
    builtin_strncpy(i_fname,"Undefined",10);
    builtin_strncpy(v_fname,"Undefined",10);
    builtin_strncpy(c_fname,"Undefined",10);
    builtin_strncpy(h_fname,"Undefined",10);
    bVar8 = true;
    __src = c_fname;
    __dest = (char *)histo;
    if (4 < argc) {
      uVar17 = 4;
      bVar8 = false;
LAB_00104487:
      __s2 = (char **)argv[uVar17];
      __dest = "-NR";
      __src = (char *)__s2;
      iVar9 = strcmp("-NR",(char *)__s2);
      piVar11 = sm;
      if (iVar9 == 0) {
LAB_001045c5:
        *piVar11 = 0;
        iVar9 = 1;
      }
      else {
        iVar9 = strcmp("-F",(char *)__s2);
        if (iVar9 == 0) {
          uVar10 = uVar17 + 1;
          if ((int)uVar10 < argc) {
            __isoc99_sscanf(argv[uVar10],"%f",trsh);
            __src = argv[uVar10];
            __dest = (char *)local_d8;
            strcpy(__dest,__src);
            if (*sf != 1) {
              *sf = 1;
              *f_type = 0;
              goto LAB_0010472a;
            }
          }
          else {
            valid_option_cold_9();
          }
          valid_option_cold_10();
LAB_00104b06:
          valid_option_cold_8();
          goto LAB_00104b0b;
        }
        iVar9 = strcmp("-C",(char *)__s2);
        if (iVar9 == 0) {
          if (argc <= (int)(uVar17 + 3)) goto LAB_00104b06;
          strcpy(c_fname,argv[(ulong)uVar17 + 1]);
          __isoc99_sscanf(argv[(ulong)uVar17 + 2],"%d",nbin);
          __dest = argv[uVar17 + 3];
          __src = "%f";
          __isoc99_sscanf(__dest,"%f",incr);
          *h_type = 0;
          *histo = 1;
          iVar9 = 4;
        }
        else {
          __dest = "-P";
          __src = (char *)__s2;
          iVar9 = strcmp("-P",(char *)__s2);
          piVar11 = sp;
          if (iVar9 == 0) goto LAB_001045c5;
          __dest = "-L";
          __src = (char *)__s2;
          iVar9 = strcmp("-L",(char *)__s2);
          if (iVar9 == 0) {
            if (argc <= (int)(uVar17 + 1)) goto LAB_00104b29;
            __dest = argv[uVar17 + 1];
            piVar11 = level;
          }
          else {
            __dest = "-I";
            ppcVar19 = __s2;
            iVar9 = strcmp("-I",(char *)__s2);
            if (iVar9 == 0) {
              __s2 = ppcVar19;
              if (argc <= (int)(uVar17 + 1)) goto LAB_00104b2e;
              __dest = argv[uVar17 + 1];
              piVar11 = iter;
            }
            else {
              __dest = "-W";
              __src = (char *)__s2;
              iVar9 = strcmp("-W",(char *)__s2);
              if (iVar9 != 0) {
                __dest = "-N";
                __src = (char *)__s2;
                iVar9 = strcmp("-N",(char *)__s2);
                if (iVar9 == 0) {
                  if ((int)(uVar17 + 2) < argc) {
                    __isoc99_sscanf(argv[(ulong)uVar17 + 1],"%d",n1);
                    __dest = argv[uVar17 + 2];
                    __src = "%d";
                    __isoc99_sscanf(__dest,"%d",n2);
                    bVar8 = true;
                    iVar9 = 3;
                    goto LAB_0010472f;
                  }
                  goto LAB_00104b47;
                }
                __dest = "-B";
                iVar9 = strcmp("-B",(char *)__s2);
                if (iVar9 != 0) goto LAB_00104b33;
                if (argc <= (int)(uVar17 + 2)) goto LAB_00104b38;
                __isoc99_sscanf(argv[(ulong)uVar17 + 1],"%d",col);
                __dest = argv[uVar17 + 2];
                __src = "%d";
                __isoc99_sscanf(__dest,"%d",row);
                *binary = 1;
                iVar9 = 3;
                goto LAB_0010472f;
              }
              if (argc <= (int)(uVar17 + 1)) goto LAB_00104b3d;
              __dest = argv[uVar17 + 1];
              piVar11 = ssd;
            }
          }
          __src = "%d";
          __isoc99_sscanf(__dest,"%d",piVar11);
LAB_0010472a:
          iVar9 = 2;
        }
      }
LAB_0010472f:
      uVar17 = uVar17 + iVar9;
      if (argc <= (int)uVar17) goto LAB_00104789;
      goto LAB_00104487;
    }
    goto LAB_001047a6;
  }
  valid_option_cold_1();
  __src = (char *)argv;
LAB_00104b15:
  valid_option_cold_15();
LAB_00104b1a:
  valid_option_cold_14();
LAB_00104b1f:
  valid_option_cold_12();
LAB_00104b24:
  valid_option_cold_11();
LAB_00104b29:
  valid_option_cold_7();
  __s2 = (char **)__src;
LAB_00104b2e:
  valid_option_cold_6();
LAB_00104b33:
  valid_option_cold_2();
LAB_00104b38:
  valid_option_cold_3();
  __src = (char *)__s2;
LAB_00104b3d:
  valid_option_cold_5();
LAB_00104b42:
  valid_option_cold_13();
LAB_00104b47:
  valid_option_cold_4();
  if ((*(int *)__dest == *(int *)((long)__dest + 4)) && (*(int *)__src == *(int *)((long)__src + 4))
     ) {
    return;
  }
  valid_size_cold_1();
  iVar9 = *(int *)__dest;
  iVar18 = *(int *)((long)__dest + 4);
  iVar3 = *(int *)((long)__dest + 8);
  p = (qnode_ptr_t)malloc(0x40);
  p->res = iVar9;
  p->sizx = iVar18;
  p->sizy = iVar3;
  iVar14 = 0;
  p->level = 0;
  p_00 = (qnode_ptr_t)malloc(0x40);
  p_00->res = iVar9;
  p_00->sizx = iVar18;
  p_00->sizy = iVar3;
  p_00->level = 0;
  alloc_flow(p);
  alloc_flow(p_00);
  if (0 < *(int *)((long)__dest + 8)) {
    do {
      if (0 < *(int *)((long)__dest + 4)) {
        iVar9 = p_00->res;
        padVar4 = p_00->flow_ptr;
        lVar13 = 0;
        do {
          (*padVar4)[(long)iVar9 * (long)iVar14 + lVar13] =
               *(disp_vect_t *)
                (*(long *)((long)__dest + 0x28) + ((long)*(int *)__dest * (long)iVar14 + lVar13) * 8
                );
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)__dest + 4));
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < *(int *)((long)__dest + 8));
  }
  if (0 < extraout_EDX) {
    iVar9 = 0;
    do {
      iVar18 = *(int *)((long)__dest + 8);
      bVar8 = 0 < iVar18;
      if (0 < iVar18) {
        uVar17 = *(uint *)((long)__dest + 4);
        iVar14 = 0;
        iVar3 = -1;
        iStack_1f0 = 1;
        do {
          if (0 < (int)uVar17) {
            padVar4 = p->flow_ptr;
            iVar21 = p->res * iVar14;
            uVar23 = 0;
            do {
              bVar7 = iVar18 <= iVar14 + 1;
              if (bVar7) {
                fVar25 = 0.0;
                fVar33 = 0.0;
              }
              else {
                lVar13 = (long)p_00->res * (long)iStack_1f0 + uVar23;
                fVar25 = (*p_00->flow_ptr)[lVar13].x + 0.0;
                fVar33 = (*p_00->flow_ptr)[lVar13].y + 0.0;
              }
              bVar22 = !bVar7;
              if (iVar14 != 0) {
                lVar13 = (long)iVar3 * (long)p_00->res + uVar23;
                fVar25 = fVar25 + (*p_00->flow_ptr)[lVar13].x;
                fVar33 = fVar33 + (*p_00->flow_ptr)[lVar13].y;
                bVar22 = bVar22 + 1;
              }
              uVar1 = uVar23 + 1;
              if ((bool)((long)uVar1 < (long)(int)uVar17 & bVar8)) {
                iVar15 = p_00->res * iVar14 + (int)uVar23 + 1;
                fVar25 = fVar25 + (*p_00->flow_ptr)[iVar15].x;
                fVar33 = fVar33 + (*p_00->flow_ptr)[iVar15].y;
                bVar22 = bVar22 + 1;
              }
              if (uVar23 != 0 && bVar8 == true) {
                iVar15 = p_00->res * iVar14 + (int)uVar23 + -1;
                fVar25 = fVar25 + (*p_00->flow_ptr)[iVar15].x;
                fVar33 = fVar33 + (*p_00->flow_ptr)[iVar15].y;
                bVar22 = bVar22 + 1;
              }
              (*padVar4)[(long)iVar21 + uVar23].x = fVar25 / (float)bVar22;
              (*padVar4)[(long)iVar21 + uVar23].y = fVar33 / (float)bVar22;
              uVar23 = uVar1;
            } while (uVar17 != uVar1);
          }
          iVar14 = iVar14 + 1;
          iVar3 = iVar3 + 1;
          iStack_1f0 = iStack_1f0 + 1;
          bVar8 = iVar14 < iVar18;
        } while (iVar14 != iVar18);
      }
      if (0 < *(int *)((long)__dest + 8)) {
        iStack_1ec = 0;
        do {
          if (0 < *(int *)((long)__dest + 4)) {
            padVar4 = p->flow_ptr;
            padVar5 = p_00->flow_ptr;
            iVar18 = p_00->res * iStack_1ec;
            lVar16 = (long)iStack_1ec;
            lVar13 = p->res * lVar16;
            lVar24 = 0;
            do {
              fVar25 = (*padVar4)[lVar13 + lVar24].x;
              fVar33 = (*padVar4)[lVar13 + lVar24].y;
              pcVar6 = *(char **)((long)__src + 0x20);
              lVar12 = *(int *)__src * lVar16 + lVar24;
              fVar34 = *(float *)(pcVar6 + lVar12 * 0xc + 8);
              fVar2 = *(float *)(pcVar6 + lVar12 * 0xc + 4);
              lVar20 = *(int *)__dest * lVar16 + lVar24;
              fVar37 = *(float *)(*(long *)((long)__dest + 0x28) + lVar20 * 8);
              fVar35 = *(float *)(*(long *)((long)__dest + 0x28) + 4 + lVar20 * 8);
              dVar30 = (double)-*(float *)(pcVar6 + lVar12 * 0xc);
              dVar31 = cos(dVar30);
              dVar32 = sin(dVar30);
              fVar26 = (float)(dVar32 * 0.0 + dVar31);
              dVar31 = sin(dVar30);
              dVar30 = cos(dVar30);
              fVar27 = (float)(dVar30 * 0.0 - dVar31);
              dVar30 = (double)-*(float *)(*(char **)((long)__src + 0x20) +
                                          (*(int *)__src * lVar16 + lVar24) * 0xc);
              dVar31 = cos(dVar30);
              dVar32 = sin(dVar30);
              fVar28 = (float)(dVar31 * 0.0 + dVar32);
              dVar31 = sin(dVar30);
              dVar30 = cos(dVar30);
              fVar29 = (float)(dVar31 * -0.0 + dVar30);
              fVar37 = fVar37 - fVar25;
              fVar35 = fVar35 - fVar33;
              fVar36 = (fVar37 * fVar28 + fVar35 * fVar29) * (fVar34 / (fVar34 + 1.0));
              fVar34 = (fVar37 * fVar26 + fVar35 * fVar27) * (fVar2 / (fVar2 + 1.0));
              (*padVar5)[iVar18 + lVar24].x = fVar26 * fVar34 + fVar28 * fVar36 + fVar25;
              (*padVar5)[iVar18 + lVar24].y = fVar34 * fVar27 + fVar36 * fVar29 + fVar33;
              lVar24 = lVar24 + 1;
            } while (lVar24 < *(int *)((long)__dest + 4));
          }
          iStack_1ec = iStack_1ec + 1;
        } while (iStack_1ec < *(int *)((long)__dest + 8));
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != extraout_EDX);
  }
  if (0 < *(int *)((long)__dest + 8)) {
    iVar9 = 0;
    do {
      if (0 < *(int *)((long)__dest + 4)) {
        iVar18 = p_00->res;
        padVar4 = p_00->flow_ptr;
        lVar13 = 0;
        do {
          *(disp_vect_t *)
           (*(long *)((long)__dest + 0x28) + ((long)*(int *)__dest * (long)iVar9 + lVar13) * 8) =
               (*padVar4)[(long)iVar18 * (long)iVar9 + lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)((long)__dest + 4));
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)((long)__dest + 8));
  }
  dealloc_flow(p);
  dealloc_flow(p_00);
  free(p);
  free(p_00);
  return;
LAB_00104789:
  bVar8 = !bVar8;
LAB_001047a6:
  if (100 < *nbin) goto LAB_00104b15;
  if (4 < *level) goto LAB_00104b1a;
  if ((7 < (uint)*ssd) || ((0xa8U >> (*ssd & 0x1fU) & 1) == 0)) goto LAB_00104b42;
  if (bVar8) goto LAB_00104b1f;
  if (*n1 != *n2) {
    concat(argv[1],"/",in_path);
    concat(argv[2],"/",out_path);
    concat(in_path,argv[3],i_fname);
    local_128[2] = 0;
    local_128[0] = '-';
    local_128[1] = 'n';
    sprintf(local_88,"%d",(ulong)(uint)*n1);
    concat(local_128,local_88,local_128);
    concat(local_128,"-",local_128);
    sprintf(local_88,"%d",(ulong)(uint)*n2);
    concat(local_128,local_88,local_128);
    concat(local_128,"-w",local_128);
    sprintf(local_88,"%d",(ulong)(uint)*ssd);
    concat(local_128,local_88,local_128);
    concat(local_128,"-l",local_128);
    sprintf(local_88,"%d",(ulong)(uint)*level);
    concat(local_128,local_88,local_128);
    concat(local_128,"-i",local_128);
    sprintf(local_88,"%d",(ulong)(uint)*iter);
    concat(local_128,local_88,local_128);
    if (*sm == 0) {
      concat(local_128,"-r",local_128);
    }
    if (*sp == 0) {
      concat(local_128,"-s",local_128);
    }
    if (*sf != 0) {
      concat(local_128,"-f",local_128);
      concat(local_128,(char *)local_d8,local_128);
    }
    concat(out_path,*argv,v_fname);
    concat(v_fname,".",v_fname);
    concat(v_fname,argv[3],v_fname);
    concat(v_fname,"F",v_fname);
    concat(v_fname,local_128,v_fname);
    if (*histo != 0) {
      concat(out_path,*argv,h_fname);
      concat(h_fname,".",h_fname);
      concat(h_fname,argv[3],h_fname);
      concat(h_fname,"H",h_fname);
      concat(h_fname,local_128,h_fname);
    }
    printf(" Generated velocity filename  : %s\n",v_fname);
    printf(" Generated histogram filename : %s\n",h_fname);
    printf(" Input stem name              : %s\n",i_fname);
    printf(" Correct velocity filename    : %s\n",c_fname);
    fflush(_stdout);
    return;
  }
  goto LAB_00104b24;
}

Assistant:

void valid_option(argc,argv,in_path,out_path,n1,n2,level,h_type,histo,sm,sp,sf,pyr,
ssd,f_type,trsh,i_fname,v_fname,c_fname,h_fname,nbin,incr,iter,binary,row,col)
char *argv[] ;
int argc, *n1, *n2, *iter, *level, *h_type, *histo, *sm, *sp, *sf, *pyr,
    *f_type, *nbin, *ssd, *binary, *row, *col ;
float *trsh, *incr ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ string ext, t0, str_trsh ;
  int i, fn ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 24) && (argc >= 4)) {
    *binary = FALSE ;
    *sm = TRUE ;
    *sp = TRUE ;
    *sf = FALSE ;
    *pyr = LAP ;
    *level = DEFLEVEL ;
    *histo = FALSE ;
    fn = FALSE ;
    *ssd = 3 ;
    *trsh = 0.0 ;
    *nbin = 0 ;
    *iter = RELAXITER ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-NR",argv[i]) == 0) {
      *sm = FALSE ;
      i += 1 ;
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          if (*sf == TRUE) {
            error(3) ;
          }
          *sf = TRUE ;
          *f_type = CMIN ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *h_type = CMIN ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-P",argv[i]) == 0) {
            *sp = FALSE ;
            i += 1 ;
          }
          else {
            if (strcmp("-L",argv[i]) == 0) {
              if ( i + 1 < argc) {
                sscanf(argv[i+1],"%d",level) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-I",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%d",iter) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-W",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",ssd) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-N",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",n1) ;
                      sscanf(argv[i+2],"%d",n2) ;
                      fn = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-B",argv[i]) == 0) {
                      if (i + 2 < argc) {
                        sscanf(argv[i+1],"%d",col) ;
                        sscanf(argv[i+2],"%d",row) ;
                        *binary = TRUE ;
                        i += 3 ;
                      }
                      else {
                        error(1) ;
                      }
                    }
                    else {
                      error(2) ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(13) ;
  }
  if (*level > MAXLEVEL) {
    error(4) ;
  }
  if (*ssd != 3 && *ssd != 5 && *ssd != 7) {
    error(16) ;
  }
  if (!fn) {
    error(17) ;
  }
  if (*n1 == *n2) {
    error(18) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;

  concat(in_path,argv[3],i_fname) ;

  strcpy(ext,"-n") ;
  sprintf(t0,"%d",*n1);
  concat(ext,t0,ext) ;
  concat(ext,"-",ext) ;
  sprintf(t0,"%d",*n2);
  concat(ext,t0,ext) ;
  concat(ext,"-w",ext) ;
  sprintf(t0,"%d",*ssd);
  concat(ext,t0,ext) ;
  concat(ext,"-l",ext) ;
  sprintf(t0,"%d",*level);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  if (!(*sm)) {
    concat(ext,"-r",ext) ;
  }
  if (!(*sp)) {
    concat(ext,"-s",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}